

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O0

void test_errors(void)

{
  ostream *this;
  anon_class_8_1_54a39808 local_d8;
  function<void_()> local_d0;
  allocator<char> local_a9;
  string local_a8;
  anon_class_8_1_54a39808 local_88;
  function<void_()> local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  anon_class_16_1_54a39808 t;
  shared_ptr<JSONHandler> h;
  
  this = std::operator<<((ostream *)&std::cout,"-- errors --");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  make_all_handler();
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)local_28,
             (shared_ptr<JSONHandler> *)
             &t.h.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"bad type at top",&local_49);
  local_88.h = (shared_ptr<JSONHandler> *)
               &t.h.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::function<void()>::function<test_errors()::__0,void>((function<void()> *)&local_80,&local_88);
  test_errors::anon_class_16_1_54a39808::operator()
            ((anon_class_16_1_54a39808 *)local_28,&local_48,&local_80);
  std::function<void_()>::~function(&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"unexpected key",&local_a9)
  ;
  local_d8.h = (shared_ptr<JSONHandler> *)
               &t.h.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::function<void()>::function<test_errors()::__1,void>((function<void()> *)&local_d0,&local_d8);
  test_errors::anon_class_16_1_54a39808::operator()
            ((anon_class_16_1_54a39808 *)local_28,&local_a8,&local_d0);
  std::function<void_()>::~function(&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  test_errors()::$_2::~__2((__2 *)local_28);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &t.h.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_errors()
{
    std::cout << "-- errors --" << std::endl;
    auto h = make_all_handler();
    auto t = [h](std::string const& msg, std::function<void()> fn) {
        try {
            fn();
            assert(false);
        } catch (QPDFUsage& e) {
            std::cout << msg << ": " << e.what() << std::endl;
        }
    };

    t("bad type at top", [&h]() { h->handle(".", JSON::makeString("oops")); });
    t("unexpected key", [&h]() {
        JSON j = JSON::parse(R"({"x": "y"})");
        h->handle(".", j);
    });
}